

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O0

QString * quotedStringLiteral(QString *value)

{
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QLatin1StringView s_02;
  QLatin1StringView s_03;
  QLatin1StringView s_04;
  qsizetype qVar1;
  char16_t *pcVar2;
  QStringBuilder<QLatin1String,_QString> *in_RSI;
  QLatin1String *in_RDI;
  long in_FS_OFFSET;
  ushort code;
  int i;
  int len;
  QString *result;
  QChar character;
  QString *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee4;
  QLatin1String *this;
  undefined2 in_stack_fffffffffffffef8;
  char16_t cVar3;
  int iVar4;
  QLatin1String *a;
  QLatin1Char local_e5 [3];
  QChar local_e2;
  undefined1 local_e0 [24];
  undefined1 local_c8 [86];
  char16_t local_72;
  QChar local_e;
  QLatin1Char local_b [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->m_size)->d = (Data *)0xaaaaaaaaaaaaaaaa;
  in_RDI->m_data = (char *)0xaaaaaaaaaaaaaaaa;
  in_RDI[1].m_size = -0x5555555555555556;
  this = in_RDI;
  a = in_RDI;
  QString::QString((QString *)0x13e3f9);
  qVar1 = QString::size((QString *)in_RSI);
  QString::reserve((QString *)this,(qsizetype)in_RSI);
  QLatin1Char::QLatin1Char(local_b,'\"');
  QChar::QChar<QLatin1Char,_true>
            ((QChar *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (QLatin1Char)(char)((ulong)in_RDI >> 0x38));
  QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                      (QChar)(char16_t)((ulong)in_RDI >> 0x30));
  for (iVar4 = 0; iVar4 < (int)qVar1; iVar4 = iVar4 + 1) {
    local_e.ucs = L'ꪪ';
    local_e = QString::at((QString *)in_RDI,
                          CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    pcVar2 = QChar::unicode(&local_e);
    cVar3 = *pcVar2;
    in_stack_fffffffffffffee4 = (uint)(ushort)cVar3;
    if (in_stack_fffffffffffffee4 == 8) {
      QLatin1String::QLatin1String(this,(char *)in_RDI);
      s_01.m_data._0_2_ = in_stack_fffffffffffffef8;
      s_01.m_size = (qsizetype)this;
      s_01.m_data._2_2_ = cVar3;
      s_01.m_data._4_4_ = iVar4;
      QString::operator+=(in_stack_fffffffffffffed8,s_01);
    }
    else if (in_stack_fffffffffffffee4 == 9) {
      QLatin1String::QLatin1String(this,(char *)in_RDI);
      s_04.m_data._0_2_ = in_stack_fffffffffffffef8;
      s_04.m_size = (qsizetype)this;
      s_04.m_data._2_2_ = cVar3;
      s_04.m_data._4_4_ = iVar4;
      QString::operator+=(in_stack_fffffffffffffed8,s_04);
    }
    else if (in_stack_fffffffffffffee4 == 10) {
      QLatin1String::QLatin1String(this,(char *)in_RDI);
      s_02.m_data._0_2_ = in_stack_fffffffffffffef8;
      s_02.m_size = (qsizetype)this;
      s_02.m_data._2_2_ = cVar3;
      s_02.m_data._4_4_ = iVar4;
      QString::operator+=(in_stack_fffffffffffffed8,s_02);
    }
    else if (in_stack_fffffffffffffee4 == 0xd) {
      QLatin1String::QLatin1String(this,(char *)in_RDI);
      s_03.m_data._0_2_ = in_stack_fffffffffffffef8;
      s_03.m_size = (qsizetype)this;
      s_03.m_data._2_2_ = cVar3;
      s_03.m_data._4_4_ = iVar4;
      QString::operator+=(in_stack_fffffffffffffed8,s_03);
    }
    else if (in_stack_fffffffffffffee4 == 0x22) {
      QLatin1String::QLatin1String(this,(char *)in_RDI);
      s_00.m_data._0_2_ = in_stack_fffffffffffffef8;
      s_00.m_size = (qsizetype)this;
      s_00.m_data._2_2_ = cVar3;
      s_00.m_data._4_4_ = iVar4;
      QString::operator+=(in_stack_fffffffffffffed8,s_00);
    }
    else if (in_stack_fffffffffffffee4 == 0x5c) {
      QLatin1String::QLatin1String(this,(char *)in_RDI);
      s.m_data._0_2_ = in_stack_fffffffffffffef8;
      s.m_size = (qsizetype)this;
      s.m_data._2_2_ = cVar3;
      s.m_data._4_4_ = iVar4;
      QString::operator+=(in_stack_fffffffffffffed8,s);
    }
    else if (((ushort)cVar3 < 0x20) || (0x7f < (ushort)cVar3)) {
      QLatin1String::QLatin1String(this,(char *)in_RDI);
      QString::number((int)local_e0,(uint)(ushort)cVar3);
      QChar::QChar<char,_true>(&local_e2,'0');
      QString::rightJustified((longlong)local_c8,(QChar)(char16_t)local_e0,true);
      operator+(in_RDI,(QString *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      operator+=((QString *)a,in_RSI);
      QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                ((QStringBuilder<QLatin1String,_QString> *)0x13e700);
      QString::~QString((QString *)0x13e70a);
      QString::~QString((QString *)0x13e714);
    }
    else {
      local_72 = local_e.ucs;
      QString::operator+=((QString *)(ulong)CONCAT24(cVar3,in_stack_fffffffffffffee0),
                          (QChar)(char16_t)((ulong)in_RDI >> 0x30));
    }
  }
  QLatin1Char::QLatin1Char(local_e5,'\"');
  QChar::QChar<QLatin1Char,_true>
            ((QChar *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (QLatin1Char)(char)((ulong)in_RDI >> 0x38));
  QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                      (QChar)(char16_t)((ulong)in_RDI >> 0x30));
  QString::squeeze((QString *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString quotedStringLiteral(const QString &value)
{
    QString result;
    const int len = value.size();
    result.reserve(int(len * 1.1) + 2);

    result += QLatin1Char('"');

    // Escape
    for (int i = 0; i < len; ++i) {
        QChar character = value.at(i);
        ushort code = character.unicode();
        switch (code) {
        case '\\':
            result += QLatin1String("\\\\");
            break;
        case '"':
            result += QLatin1String("\\\"");
            break;
        case '\b':
            result += QLatin1String("\\b");
            break;
        case '\n':
            result += QLatin1String("\\n");
            break;
        case '\r':
            result += QLatin1String("\\r");
            break;
        case '\t':
            result += QLatin1String("\\t");
            break;
        default:
            if (code >= 32 && code <= 127)
                result += character;
            else
                result += QLatin1String("\\u") + QString::number(code, 16).rightJustified(4, '0');
        }
    }

    result += QLatin1Char('"');

    result.squeeze();
    return result;
}